

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O1

size_type find(string *text,string *pattern,size_type begin,bool sensitive)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  undefined7 in_register_00000009;
  char *p;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  size_type local_48;
  
  pcVar1 = (pattern->_M_dataplus)._M_p;
  uVar2 = pattern->_M_string_length;
  if ((int)CONCAT71(in_register_00000009,sensitive) != 0) {
    sVar8 = std::__cxx11::string::find((char *)text,(ulong)pcVar1,begin);
    return sVar8;
  }
  if (uVar2 == 0) {
    sVar8 = 0;
  }
  else {
    uVar3 = text->_M_string_length;
    sVar8 = 0xffffffffffffffff;
    if (begin < uVar3) {
      pcVar4 = (text->_M_dataplus)._M_p;
      pcVar9 = pcVar4 + begin;
      if (pcVar9 <= pcVar4 + (uVar3 - uVar2)) {
        iVar5 = tolower((int)*pcVar1);
        do {
          iVar6 = tolower((int)*pcVar9);
          bVar11 = true;
          if (iVar6 == iVar5) {
            uVar10 = 0;
            do {
              if (uVar2 - 1 == uVar10) {
                local_48 = (long)pcVar9 - (long)pcVar4;
                bVar11 = false;
                goto LAB_0013d8d7;
              }
              iVar6 = tolower((int)pcVar9[uVar10 + 1]);
              iVar7 = tolower((int)pcVar1[uVar10 + 1]);
              uVar10 = uVar10 + 1;
            } while (iVar6 == iVar7);
            bVar11 = uVar10 < uVar2;
          }
LAB_0013d8d7:
          if (!bVar11) {
            return local_48;
          }
          pcVar9 = pcVar9 + 1;
        } while (pcVar9 <= pcVar4 + (uVar3 - uVar2));
        sVar8 = 0xffffffffffffffff;
      }
    }
  }
  return sVar8;
}

Assistant:

std::string::size_type find (
  const std::string& text,
  const std::string& pattern,
  std::string::size_type begin,
  bool sensitive)
{
  // Implement a sensitive find, which is really just a loop withing a loop,
  // comparing lower-case versions of each character in turn.
  if (!sensitive)
  {
    // Handle empty pattern.
    const char* p = pattern.c_str ();
    size_t len = pattern.length ();
    if (len == 0)
      return 0;

    // Handle bad begin.
    if (begin >= text.length ())
      return std::string::npos;

    // Evaluate these once, for performance reasons.
    const char* start = text.c_str ();
    const char* t = start + begin;
    const char* end = start + text.size ();

    for (; t <= end - len; ++t)
    {
      int diff = 0;
      for (size_t i = 0; i < len; ++i)
        if ((diff = tolower (t[i]) - tolower (p[i])))
          break;

      // diff == 0 means there was no break from the loop, which only occurs
      // when a difference is detected.  Therefore, the loop terminated, and
      // diff is zero.
      if (diff == 0)
        return t - start;
    }

    return std::string::npos;
  }

  // Otherwise, just use std::string::find.
  return text.find (pattern, begin);
}